

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O2

string * __thiscall
Diligent::BasicFileSystem::FileDialog_abi_cxx11_
          (string *__return_storage_ptr__,BasicFileSystem *this,FileDialogAttribs *DialogAttribs)

{
  string _msg;
  
  FormatString<char[48]>(&_msg,(char (*) [48])"File dialog is not implemented on this platform");
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&_msg);
  return __return_storage_ptr__;
}

Assistant:

std::string BasicFileSystem::FileDialog(const FileDialogAttribs& DialogAttribs)
{
    LOG_WARNING_MESSAGE("File dialog is not implemented on this platform");
    return "";
}